

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass.hpp
# Opt level: O3

void __thiscall squall::Klass<Foo,_void>::Klass(Klass<Foo,_void> *this,VM *vm,string *name)

{
  _Atomic_word *p_Var1;
  int iVar2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  this->vm_ = vm;
  (this->imp_).super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->imp_).super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  KlassTable::add_klass<Foo,void>
            ((KlassTable *)&stack0xffffffffffffffe0,(HSQUIRRELVM)&vm->klass_table_,
             (string *)(vm->imp_).vm_);
  std::__weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->imp_).
              super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>,
             (__weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffe0);
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_18._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_18._M_pi)->_M_weak_count;
      (local_18._M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_18._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

Klass(VM& vm, const string& name) : vm_(vm) {
        imp_ = vm.klass_table().add_klass<C, Base>(vm_.handle(), name);
    }